

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  BoxPoint *__args;
  long lVar4;
  void *pvVar5;
  char cVar6;
  int iVar7;
  undefined8 uVar8;
  ulong uVar9;
  long lVar10;
  undefined8 *in_R8;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  undefined4 uVar14;
  double dVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  vector<BoxPoint,_std::allocator<BoxPoint>_> centers;
  vector<BoxPoint,_std::allocator<BoxPoint>_> predictedTrajectory;
  vector<BoxPoint,_std::allocator<BoxPoint>_> initialTrajectory;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  contours;
  Rect rect;
  string videoFile;
  VideoCapture vid;
  Mat frame;
  Mat lastFrame;
  Mat firstFrame;
  Mat thresh;
  Mat frameDelta;
  Mat grayFrame;
  _InputArray *in_stack_fffffffffffffb88;
  _InputArray local_470;
  _InputArray local_458;
  undefined4 uStack_440;
  undefined4 uStack_43c;
  _InputArray local_438;
  _InputArray local_418;
  undefined8 uStack_400;
  vector<BoxPoint,_std::allocator<BoxPoint>_> local_3b8;
  BoxPoint local_398;
  _InputArray local_378;
  ulong local_358;
  vector<BoxPoint,_std::allocator<BoxPoint>_> local_350;
  undefined8 local_338;
  undefined8 local_330;
  undefined8 local_328;
  undefined8 local_320;
  double local_318;
  double dStack_310;
  long *local_308 [2];
  long local_2f8 [2];
  undefined8 local_2e8;
  _InputArray *p_Stack_2e0;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  _OutputArray local_2b8 [2];
  BoxPoint local_288 [3];
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  local_228;
  BoxPoint local_210 [3];
  BoxPoint local_1b0 [3];
  BoxPoint local_150 [3];
  BoxPoint local_f0 [3];
  BoxPoint local_90 [3];
  
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Requires 1 Argument",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_308,argv[1],(allocator<char> *)local_1b0);
    cv::VideoCapture::VideoCapture((VideoCapture *)local_2b8,(string *)local_308,0);
    cv::Mat::Mat((Mat *)local_1b0);
    cv::Mat::Mat((Mat *)local_288);
    cv::Mat::Mat((Mat *)local_90);
    cv::Mat::Mat((Mat *)local_f0);
    cv::Mat::Mat((Mat *)local_150);
    cv::Mat::Mat((Mat *)local_210);
    local_398.yWidth = 0.0;
    local_398.x = 0.0;
    local_398.yHeight = 0.0;
    local_418.sz.width = 0;
    local_418.sz.height = 0;
    local_418.flags = 0x2010000;
    local_418.obj = local_288;
    cv::VideoCapture::read(local_2b8);
    cv::Mat::clone();
    cv::Mat::operator=((Mat *)local_210,(Mat *)&local_418);
    cv::Mat::~Mat((Mat *)&local_418);
    local_418.sz.width = 0;
    local_418.sz.height = 0;
    local_418.flags = 0x1010000;
    local_458.sz.width = 0;
    local_458.sz.height = 0;
    local_458.flags = 0x2010000;
    local_458.obj = local_1b0;
    local_418.obj = local_288;
    cv::cvtColor((cv *)&local_418,&local_458,(_OutputArray *)0x6,0,(int)in_R8);
    local_418.sz.width = 0;
    local_418.sz.height = 0;
    local_418.flags = 0x1010000;
    local_458.sz.width = 0;
    local_458.sz.height = 0;
    local_458.flags = 0x2010000;
    local_2c0 = 0x1500000015;
    local_458.obj = local_1b0;
    local_418.obj = local_1b0;
    cv::GaussianBlur(0,0,&local_418,&local_458);
    local_3b8.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_3b8.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
    super__Vector_impl_data._M_finish = (BoxPoint *)0x0;
    local_3b8.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (BoxPoint *)0x0;
    while( true ) {
      iVar7 = (int)in_R8;
      local_418.sz.width = 0;
      local_418.sz.height = 0;
      local_418.flags = 0x2010000;
      local_418.obj = local_288;
      cVar6 = cv::VideoCapture::read(local_2b8);
      if (cVar6 == '\0') break;
      cv::Mat::clone();
      cv::Mat::operator=((Mat *)local_210,(Mat *)&local_418);
      cv::Mat::~Mat((Mat *)&local_418);
      local_418.sz.width = 0;
      local_418.sz.height = 0;
      local_418.flags = 0x1010000;
      local_418.obj = local_288;
      local_458.sz.width = 0;
      local_458.sz.height = 0;
      local_458.flags = 0x2010000;
      local_458.obj = local_90;
      cv::cvtColor((cv *)&local_418,&local_458,(_OutputArray *)0x6,0,iVar7);
      local_418.sz.width = 0;
      local_418.sz.height = 0;
      local_418.flags = 0x1010000;
      local_458.sz.width = 0;
      local_458.sz.height = 0;
      local_458.flags = 0x2010000;
      local_320 = 0x1500000015;
      local_458.obj = local_90;
      local_418.obj = local_90;
      cv::GaussianBlur(0,0,&local_418,&local_458,&local_320,4);
      local_418.sz.width = 0;
      local_418.sz.height = 0;
      local_418.flags = 0x1010000;
      local_458.sz.width = 0;
      local_458.sz.height = 0;
      local_458.flags = 0x1010000;
      local_470.sz.width = 0;
      local_470.sz.height = 0;
      local_470.flags = 0x2010000;
      local_470.obj = local_f0;
      local_458.obj = local_90;
      local_418.obj = local_1b0;
      cv::absdiff(&local_418,&local_458,(_OutputArray *)&local_470);
      local_418.sz.width = 0;
      local_418.sz.height = 0;
      local_418.flags = 0x1010000;
      local_458.sz.width = 0;
      local_458.sz.height = 0;
      local_458.flags = 0x2010000;
      local_458.obj = local_150;
      local_418.obj = local_f0;
      cv::threshold(&local_418,(_OutputArray *)&local_458,25.0,255.0,0);
      local_470.sz.width = 0;
      local_470.sz.height = 0;
      local_470.flags = 0x1010000;
      local_438.sz.width = 0;
      local_438.sz.height = 0;
      local_438.flags = 0x2010000;
      local_470.obj = local_150;
      local_438.obj = local_150;
      cv::Mat::Mat((Mat *)&local_418);
      local_378.sz.width = 0;
      local_378.sz.height = 0;
      local_378.flags = 0x1010000;
      local_328 = 0xffffffffffffffff;
      local_458.flags = -1;
      local_458._4_4_ = 0x7fefffff;
      local_458.obj = (void *)0x7fefffffffffffff;
      local_458.sz.width = -1;
      local_458.sz.height = 0x7fefffff;
      uStack_440 = 0xffffffff;
      uStack_43c = 0x7fefffff;
      in_stack_fffffffffffffb88 = &local_458;
      local_378.obj = &local_418;
      cv::dilate(&local_470,&local_438,&local_378,&local_328,2,0,&local_458);
      cv::Mat::~Mat((Mat *)&local_418);
      local_418.sz.width = 0;
      local_418.sz.height = 0;
      local_418.flags = 0x1010000;
      local_458.sz.width = 0;
      local_458.sz.height = 0;
      local_458.flags = -0x7dfbfff4;
      local_458.obj = &local_398;
      local_330 = 0;
      in_R8 = &local_330;
      local_418.obj = local_150;
      cv::findContours(&local_418,&local_458,0);
      std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::vector
                ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)&local_458,
                 ((long)local_398.yHeight - (long)local_398.x >> 3) * -0x5555555555555555,
                 (allocator_type *)&local_418);
      std::
      vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ::vector(&local_228,
               (vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                *)&local_398);
      getCenters((vector<BoxPoint,_std::allocator<BoxPoint>_> *)&local_470,&local_228);
      std::
      vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ::~vector(&local_228);
      __args = (BoxPoint *)CONCAT44(local_470._4_4_,local_470.flags);
      if ((BoxPoint *)local_470.obj != __args) {
        if (local_3b8.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_3b8.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<BoxPoint,std::allocator<BoxPoint>>::_M_realloc_insert<BoxPoint&>
                    ((vector<BoxPoint,std::allocator<BoxPoint>> *)&local_3b8,
                     (iterator)
                     local_3b8.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
                     super__Vector_impl_data._M_finish,__args);
        }
        else {
          dVar15 = __args->x;
          dVar2 = __args->yHeight;
          dVar3 = __args->z;
          (local_3b8.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
           super__Vector_impl_data._M_finish)->yWidth = __args->yWidth;
          (local_3b8.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
           super__Vector_impl_data._M_finish)->z = dVar3;
          (local_3b8.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
           super__Vector_impl_data._M_finish)->x = dVar15;
          (local_3b8.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
           super__Vector_impl_data._M_finish)->yHeight = dVar2;
          local_3b8.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_3b8.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      if (local_398.yHeight != local_398.x) {
        lVar12 = 0;
        lVar10 = 0;
        uVar13 = 0;
        do {
          local_418.obj = (void *)((long)local_398.x + lVar10);
          local_418.sz.width = 0;
          local_418.sz.height = 0;
          local_418.flags = 0x8103000c;
          dVar15 = (double)cv::contourArea(&local_418,false);
          if (300.0 <= dVar15) {
            uVar9 = ((long)local_398.yHeight - (long)local_398.x >> 3) * -0x5555555555555555;
            if (uVar9 < uVar13 || uVar9 - uVar13 == 0) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar13);
            }
            else {
              local_418.obj = (void *)((long)local_398.x + lVar10);
              local_418.sz.width = 0;
              local_418.sz.height = 0;
              local_418.flags = -0x7efcfff4;
              cv::boundingRect(&local_378);
              local_438.sz.width = 0;
              local_438.sz.height = 0;
              local_438.flags = 0x3010000;
              local_2e8 = CONCAT44(local_378._4_4_,local_378.flags);
              p_Stack_2e0 = (_InputArray *)local_378.obj;
              local_418._0_8_ = (Size *)0x0;
              local_418.obj = (BoxPoint *)0x0;
              local_418.sz.width = 0;
              local_418.sz.height = 0x406fe000;
              uStack_400 = 0;
              local_438.obj = local_288;
              cv::rectangle(&local_438,&local_2e8,&local_418,1,8,0);
              local_438.sz.width = 0;
              local_438.sz.height = 0;
              local_438.flags = 0x3010000;
              lVar4 = CONCAT44(local_470._4_4_,local_470.flags);
              local_438.obj = local_288;
              if (uVar13 < (ulong)((long)local_470.obj - lVar4 >> 5)) {
                local_338 = CONCAT44((int)*(double *)(lVar4 + 0x18 + lVar12),
                                     (int)*(double *)(lVar4 + lVar12));
                local_418._0_8_ = (Size *)0x0;
                local_418.obj = (BoxPoint *)0x0;
                local_418.sz.width = 0;
                local_418.sz.height = 0x406fe000;
                uStack_400 = 0;
                in_stack_fffffffffffffb88 =
                     (_InputArray *)((ulong)in_stack_fffffffffffffb88 & 0xffffffff00000000);
                in_R8 = (undefined8 *)0x1;
                cv::circle(&local_438,&local_338,2,&local_418,1,8,in_stack_fffffffffffffb88);
                goto LAB_00104c00;
              }
            }
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar13);
            goto LAB_00105112;
          }
LAB_00104c00:
          uVar13 = uVar13 + 1;
          lVar10 = lVar10 + 0x18;
          lVar12 = lVar12 + 0x20;
        } while (uVar13 < (ulong)(((long)local_398.yHeight - (long)local_398.x >> 3) *
                                 -0x5555555555555555));
      }
      local_418._0_8_ = &local_418.sz;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"Camera","");
      local_438.sz.width = 0;
      local_438.sz.height = 0;
      local_438.flags = 0x1010000;
      local_438.obj = local_288;
      cv::imshow((string *)&local_418,&local_438);
      if ((Size *)local_418._0_8_ != &local_418.sz) {
        operator_delete((void *)local_418._0_8_,(long)local_418.sz + 1);
      }
      cv::waitKey(0);
      iVar7 = cv::waitKey(1);
      pvVar5 = (void *)CONCAT44(local_470._4_4_,local_470.flags);
      if (pvVar5 != (void *)0x0) {
        operator_delete(pvVar5,(long)local_470.sz - (long)pvVar5);
      }
      pvVar5 = (void *)CONCAT44(local_458._4_4_,local_458.flags);
      if (pvVar5 != (void *)0x0) {
        operator_delete(pvVar5,(long)local_458.sz - (long)pvVar5);
      }
      if (iVar7 == 0x1b) break;
    }
    std::vector<BoxPoint,_std::allocator<BoxPoint>_>::vector(&local_350,&local_3b8);
    getPredictedTrajectory
              ((vector<BoxPoint,_std::allocator<BoxPoint>_> *)&local_458,&local_350,25.0,0.5);
    if (local_350.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_350.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_350.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_350.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    uVar13 = (long)local_3b8.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_3b8.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
                   super__Vector_impl_data._M_start >> 5;
    lVar10 = CONCAT44(local_458._4_4_,local_458.flags);
    uVar9 = (long)local_458.obj - lVar10 >> 5;
    if (uVar9 + uVar13 != 0) {
      lVar12 = 0;
      uVar11 = 0;
      do {
        local_358 = uVar11;
        if (uVar11 < uVar13) {
          uVar8 = *(undefined8 *)
                   ((long)&(local_3b8.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>.
                            _M_impl.super__Vector_impl_data._M_start)->x + lVar12);
          uVar14 = (undefined4)uVar8;
          uVar16 = (undefined4)((ulong)uVar8 >> 0x20);
          pdVar1 = (double *)
                   ((long)&(local_3b8.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>.
                            _M_impl.super__Vector_impl_data._M_start)->yHeight + lVar12);
          local_318 = *pdVar1;
          dStack_310 = pdVar1[1];
          uVar8 = *(undefined8 *)
                   ((long)&(local_3b8.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>.
                            _M_impl.super__Vector_impl_data._M_start)->z + lVar12);
          uVar17 = (undefined4)uVar8;
          uVar18 = (undefined4)((ulong)uVar8 >> 0x20);
          local_418._0_8_ = (Size *)0x0;
          local_418.sz.width = 0;
          local_418.sz.height = 0x406fe000;
        }
        else {
          if (uVar9 <= uVar11 - uVar13) {
LAB_00105112:
            uVar8 = std::__throw_out_of_range_fmt
                              (
                              "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                              );
            if ((void *)local_438._0_8_ != (void *)0x0) {
              operator_delete((void *)local_438._0_8_,(long)local_438.sz - local_438._0_8_);
            }
            if ((Size *)local_418._0_8_ != &local_418.sz) {
              operator_delete((void *)local_418._0_8_,(long)local_418.sz + 1);
            }
            pvVar5 = (void *)CONCAT44(local_458._4_4_,local_458.flags);
            if (pvVar5 != (void *)0x0) {
              operator_delete(pvVar5,(long)local_458.sz - (long)pvVar5);
            }
            if (local_3b8.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_3b8.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_3b8.
                                    super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_3b8.
                                    super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            std::
            vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
            ::~vector((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                       *)&local_398);
            cv::Mat::~Mat((Mat *)local_210);
            cv::Mat::~Mat((Mat *)local_150);
            cv::Mat::~Mat((Mat *)local_f0);
            cv::Mat::~Mat((Mat *)local_90);
            cv::Mat::~Mat((Mat *)local_288);
            cv::Mat::~Mat((Mat *)local_1b0);
            cv::VideoCapture::~VideoCapture((VideoCapture *)local_2b8);
            if (local_308[0] != local_2f8) {
              operator_delete(local_308[0],local_2f8[0] + 1);
            }
            _Unwind_Resume(uVar8);
          }
          lVar10 = lVar10 + uVar13 * -0x20;
          uVar14 = (undefined4)*(undefined8 *)(lVar10 + lVar12);
          uVar16 = (undefined4)((ulong)*(undefined8 *)(lVar10 + lVar12) >> 0x20);
          pdVar1 = (double *)(lVar10 + 8 + lVar12);
          local_318 = *pdVar1;
          dStack_310 = pdVar1[1];
          uVar8 = *(undefined8 *)(lVar10 + 0x18 + lVar12);
          uVar17 = (undefined4)uVar8;
          uVar18 = (undefined4)((ulong)uVar8 >> 0x20);
          local_418.sz.width = 0;
          local_418.sz.height = 0;
          local_418._0_8_ = (Size *)0x406fe00000000000;
        }
        local_418.obj = (BoxPoint *)0x0;
        uStack_400 = 0;
        local_470.sz.width = 0;
        local_470.sz.height = 0;
        local_470.flags = 0x3010000;
        in_stack_fffffffffffffb88 =
             (_InputArray *)((ulong)in_stack_fffffffffffffb88 & 0xffffffff00000000);
        local_470.obj = local_210;
        local_398.z._0_4_ = (int)(double)CONCAT44(uVar16,uVar14);
        local_398.z._4_4_ = -(int)(double)CONCAT44(uVar18,uVar17);
        cv::circle(&local_470,&local_398.z,2,&local_418,1,8,in_stack_fffffffffffffb88);
        local_470.sz.width = 0;
        local_470.sz.height = 0;
        local_470.flags = 0x3010000;
        local_2d0 = CONCAT44(-(int)(double)CONCAT44(uVar18,uVar17) -
                             (int)((double)(int)dStack_310 * 0.5),
                             (int)(double)CONCAT44(uVar16,uVar14) -
                             (int)((double)(int)local_318 * 0.5));
        uStack_2c8 = CONCAT44((int)dStack_310,(int)local_318);
        local_470.obj = local_210;
        cv::rectangle(&local_470,&local_2d0,&local_418,1,8,0);
        uVar11 = local_358 + 1;
        uVar13 = (long)local_3b8.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_3b8.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
                       super__Vector_impl_data._M_start >> 5;
        lVar10 = CONCAT44(local_458._4_4_,local_458.flags);
        uVar9 = (long)local_458.obj - lVar10 >> 5;
        lVar12 = lVar12 + 0x20;
      } while (uVar11 < uVar9 + uVar13);
    }
    local_418._0_8_ = &local_418.sz;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"Predicted","");
    local_470.sz.width = 0;
    local_470.sz.height = 0;
    local_470.flags = 0x1010000;
    local_470.obj = local_210;
    cv::imshow((string *)&local_418,&local_470);
    if ((Size *)local_418._0_8_ != &local_418.sz) {
      operator_delete((void *)local_418._0_8_,(long)local_418.sz + 1);
    }
    cv::waitKey(0);
    local_418._0_8_ = &local_418.sz;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"output.jpg","");
    local_470.sz.width = 0;
    local_470.sz.height = 0;
    local_470.flags = 0x1010000;
    local_438.sz.width = 0;
    local_438.sz.height = 0;
    local_438._0_8_ = (void *)0x0;
    local_438.obj = (void *)0x0;
    local_470.obj = local_210;
    cv::imwrite((string *)&local_418,&local_470,(vector *)&local_438);
    if ((void *)local_438._0_8_ != (void *)0x0) {
      operator_delete((void *)local_438._0_8_,(long)local_438.sz - local_438._0_8_);
    }
    if ((Size *)local_418._0_8_ != &local_418.sz) {
      operator_delete((void *)local_418._0_8_,(long)local_418.sz + 1);
    }
    pvVar5 = (void *)CONCAT44(local_458._4_4_,local_458.flags);
    if (pvVar5 != (void *)0x0) {
      operator_delete(pvVar5,(long)local_458.sz - (long)pvVar5);
    }
    if (local_3b8.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3b8.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_3b8.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_3b8.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ::~vector((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
               *)&local_398);
    cv::Mat::~Mat((Mat *)local_210);
    cv::Mat::~Mat((Mat *)local_150);
    cv::Mat::~Mat((Mat *)local_f0);
    cv::Mat::~Mat((Mat *)local_90);
    cv::Mat::~Mat((Mat *)local_288);
    cv::Mat::~Mat((Mat *)local_1b0);
    cv::VideoCapture::~VideoCapture((VideoCapture *)local_2b8);
    if (local_308[0] != local_2f8) {
      operator_delete(local_308[0],local_2f8[0] + 1);
    }
  }
  return 0;
}

Assistant:

int main(int argc, char** argv){
    
    if(argc <= 1){
        std::cerr << "Requires 1 Argument" << std::endl;
    }else{
        std::string videoFile = argv[1];
    
        int minContourArea = 300;
        cv::VideoCapture vid = cv::VideoCapture(videoFile);
        cv::Mat firstFrame, frame, grayFrame, frameDelta, thresh, lastFrame;
        std::vector<std::vector<cv::Point>> contours;
        vid.read(frame);
        lastFrame = frame.clone();
        cv::cvtColor(frame, firstFrame, cv::COLOR_BGR2GRAY);
        cv::GaussianBlur(firstFrame, firstFrame, cv::Size(21, 21), 0);


        std::vector<BoxPoint> initialTrajectory;
        
        while(vid.read(frame)){
            lastFrame = frame.clone();
            cv::cvtColor(frame, grayFrame, cv::COLOR_BGR2GRAY); 
            cv::GaussianBlur(grayFrame, grayFrame, cv::Size(21, 21), 0);
            cv::absdiff(firstFrame, grayFrame, frameDelta);
            cv::threshold(frameDelta, thresh, 25, 255, cv::THRESH_BINARY);
            cv::dilate(thresh, thresh, cv::Mat(), cv::Point(-1, -1), 2);
            cv::findContours(thresh, contours, cv::RETR_EXTERNAL, cv::CHAIN_APPROX_SIMPLE);
            
            std::vector<cv::Rect> boundingRect{contours.size()};
            std::vector<BoxPoint> centers = getCenters(contours);
            if(centers.size() > 0){
                initialTrajectory.emplace_back(centers.at(0));
            };
            
            for(size_t i=0; i<contours.size(); i++){
                if(cv::contourArea(contours.at(i)) < minContourArea){ continue; }
          
                cv::Rect rect = cv::boundingRect(contours.at(i));
                cv::rectangle(frame, rect, cv::Scalar(0, 0, 255), 1);

                cv::circle(frame, cv::Point{(int) centers.at(i).x, (int) centers.at(i).z}, 2, cv::Scalar(0, 0, 255));
            }
            
            cv::imshow("Camera", frame);
            cv::waitKey(0);
            if(cv::waitKey(1) == 27){
                break;
            }

        }

        std::vector<BoxPoint> predictedTrajectory = getPredictedTrajectory(initialTrajectory, 25.0, 0.50);
        for(size_t i=0; i<initialTrajectory.size()+predictedTrajectory.size(); i++){
            BoxPoint point = i < initialTrajectory.size() ? initialTrajectory.at(i) : predictedTrajectory.at(i-initialTrajectory.size());
            cv::Scalar color = i < initialTrajectory.size() ? cv::Scalar(0, 0, 255) : cv::Scalar(255, 0, 0);
                    
            cv::Point centerPoint{(int) point.x, -1 * (int) point.z};
            cv::Size boxSize = cv::Size{(int) point.yHeight, (int) point.yWidth};
            cv::Point boxStart{
                centerPoint.x - (int)(0.5*boxSize.width),
                centerPoint.y - (int)(0.5*boxSize.height)};
            cv::Rect box{boxStart, boxSize}; 

            cv::circle(lastFrame, centerPoint, 2, color);
            cv::rectangle(lastFrame, box, color);
        };
        cv::imshow("Predicted", lastFrame);
        cv::waitKey(0); 
        cv::imwrite("output.jpg", lastFrame);
    }
}